

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  Geometry *pGVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  AABBNodeMB4D *node1;
  ulong uVar20;
  byte bVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  Scene *pSVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar36 [8];
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  undefined1 auVar41 [16];
  float fVar49;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar48;
  undefined1 auVar47 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar50;
  float fVar62;
  float fVar64;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar60 [32];
  undefined8 extraout_XMM1_Qa_00;
  float fVar63;
  undefined1 auVar61 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar65;
  float fVar76;
  float fVar77;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar78;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar79;
  float fVar80;
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  float fVar81;
  float fVar95;
  float fVar96;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar97;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  undefined1 auVar102 [16];
  float fVar98;
  float fVar110;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar99;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar111;
  undefined1 auVar105 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [64];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [64];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [64];
  float fVar129;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar138;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar136;
  float fVar137;
  undefined1 auVar135 [64];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  float fVar144;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar145 [64];
  float fVar149;
  float fVar150;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar151 [64];
  float fVar158;
  undefined1 auVar159 [16];
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar160 [64];
  float fVar164;
  undefined1 auVar165 [16];
  float fVar170;
  undefined1 auVar166 [16];
  float fVar168;
  float fVar169;
  undefined1 auVar167 [64];
  float fVar171;
  float fVar176;
  undefined1 auVar172 [16];
  float fVar174;
  float fVar175;
  float fVar177;
  undefined1 auVar173 [64];
  UVIdentity<4> mapUV;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_15a9;
  undefined1 local_15a8 [8];
  float fStack_15a0;
  float fStack_159c;
  undefined1 local_1598 [16];
  float local_1588;
  float fStack_1584;
  float fStack_1580;
  float fStack_157c;
  undefined8 local_1578;
  float fStack_1570;
  float fStack_156c;
  Ray *local_1568;
  int local_155c;
  undefined8 local_1558;
  float fStack_1550;
  float fStack_154c;
  undefined1 local_1548 [8];
  float fStack_1540;
  float fStack_153c;
  undefined1 local_1538 [8];
  float fStack_1530;
  float fStack_152c;
  RayQueryContext *local_1528;
  Scene *local_1520;
  undefined1 local_1518 [8];
  float fStack_1510;
  float fStack_150c;
  undefined1 local_1508 [16];
  undefined1 local_14f8 [16];
  undefined1 local_14e8 [8];
  float fStack_14e0;
  float fStack_14dc;
  ulong local_14d8;
  long local_14d0;
  long local_14c8;
  ulong *local_14c0;
  uint local_14b8;
  uint local_14b4;
  undefined4 local_14b0;
  undefined4 local_14ac;
  undefined4 local_14a8;
  undefined4 local_14a4;
  uint local_14a0;
  uint local_149c;
  uint local_1498;
  RTCFilterFunctionNArguments local_1488;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined1 local_1448 [16];
  undefined1 local_1438 [16];
  undefined1 local_1428 [16];
  undefined1 local_1418 [16];
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [16];
  undefined1 *local_13b8;
  undefined1 local_13a8 [16];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [32];
  undefined1 local_1318 [32];
  undefined1 local_12f8 [32];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8 [565];
  
  local_11d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8[0] != 8) {
    fVar149 = ray->tfar;
    auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar149) {
      local_14c0 = local_11d8 + 1;
      aVar5 = (ray->dir).field_0;
      auVar12 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar91._8_4_ = 0x7fffffff;
      auVar91._0_8_ = 0x7fffffff7fffffff;
      auVar91._12_4_ = 0x7fffffff;
      auVar91 = vandps_avx((undefined1  [16])aVar5,auVar91);
      auVar51._8_4_ = 0x219392ef;
      auVar51._0_8_ = 0x219392ef219392ef;
      auVar51._12_4_ = 0x219392ef;
      auVar91 = vcmpps_avx(auVar91,auVar51,1);
      auVar100._8_4_ = 0x3f800000;
      auVar100._0_8_ = 0x3f8000003f800000;
      auVar100._12_4_ = 0x3f800000;
      auVar51 = vdivps_avx(auVar100,(undefined1  [16])aVar5);
      auVar101._8_4_ = 0x5d5e0b6b;
      auVar101._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar101._12_4_ = 0x5d5e0b6b;
      auVar91 = vblendvps_avx(auVar51,auVar101,auVar91);
      auVar82._0_4_ = auVar91._0_4_ * 0.99999964;
      auVar82._4_4_ = auVar91._4_4_ * 0.99999964;
      auVar82._8_4_ = auVar91._8_4_ * 0.99999964;
      auVar82._12_4_ = auVar91._12_4_ * 0.99999964;
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      local_1218._4_4_ = uVar4;
      local_1218._0_4_ = uVar4;
      local_1218._8_4_ = uVar4;
      local_1218._12_4_ = uVar4;
      local_1218._16_4_ = uVar4;
      local_1218._20_4_ = uVar4;
      local_1218._24_4_ = uVar4;
      local_1218._28_4_ = uVar4;
      auVar121 = ZEXT3264(local_1218);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1238._4_4_ = uVar4;
      local_1238._0_4_ = uVar4;
      local_1238._8_4_ = uVar4;
      local_1238._12_4_ = uVar4;
      local_1238._16_4_ = uVar4;
      local_1238._20_4_ = uVar4;
      local_1238._24_4_ = uVar4;
      local_1238._28_4_ = uVar4;
      auVar135 = ZEXT3264(local_1238);
      auVar66._0_4_ = auVar91._0_4_ * 1.0000004;
      auVar66._4_4_ = auVar91._4_4_ * 1.0000004;
      auVar66._8_4_ = auVar91._8_4_ * 1.0000004;
      auVar66._12_4_ = auVar91._12_4_ * 1.0000004;
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1258._4_4_ = uVar4;
      local_1258._0_4_ = uVar4;
      local_1258._8_4_ = uVar4;
      local_1258._12_4_ = uVar4;
      local_1258._16_4_ = uVar4;
      local_1258._20_4_ = uVar4;
      local_1258._24_4_ = uVar4;
      local_1258._28_4_ = uVar4;
      auVar142 = ZEXT3264(local_1258);
      auVar91 = vshufps_avx(auVar82,auVar82,0);
      local_1278._16_16_ = auVar91;
      local_1278._0_16_ = auVar91;
      auVar143 = ZEXT3264(local_1278);
      auVar91 = vmovshdup_avx(auVar82);
      auVar51 = vshufps_avx(auVar82,auVar82,0x55);
      local_1298._16_16_ = auVar51;
      local_1298._0_16_ = auVar51;
      auVar145 = ZEXT3264(local_1298);
      auVar51 = vshufpd_avx(auVar82,auVar82,1);
      auVar100 = vshufps_avx(auVar82,auVar82,0xaa);
      local_12b8._16_16_ = auVar100;
      local_12b8._0_16_ = auVar100;
      auVar151 = ZEXT3264(local_12b8);
      auVar100 = vshufps_avx(auVar66,auVar66,0);
      local_12d8._16_16_ = auVar100;
      local_12d8._0_16_ = auVar100;
      auVar160 = ZEXT3264(local_12d8);
      auVar100 = vshufps_avx(auVar66,auVar66,0x55);
      auVar94 = ZEXT1664(auVar100);
      local_12f8._16_16_ = auVar100;
      local_12f8._0_16_ = auVar100;
      auVar167 = ZEXT3264(local_12f8);
      auVar100 = vshufps_avx(auVar66,auVar66,0xaa);
      auVar75 = ZEXT1664(auVar100);
      uVar25 = (ulong)(auVar82._0_4_ < 0.0) << 5;
      local_1318._16_16_ = auVar100;
      local_1318._0_16_ = auVar100;
      auVar173 = ZEXT3264(local_1318);
      uVar38 = (ulong)(auVar91._0_4_ < 0.0) << 5 | 0x40;
      uVar31 = (ulong)(auVar51._0_4_ < 0.0) << 5 | 0x80;
      uVar39 = uVar25 ^ 0x20;
      auVar91 = vshufps_avx(auVar12,auVar12,0);
      auVar61 = ZEXT1664(auVar91);
      local_1338._16_16_ = auVar91;
      local_1338._0_16_ = auVar91;
      auVar116 = ZEXT3264(local_1338);
      auVar91 = vshufps_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar149),0);
      local_11f8._16_16_ = auVar91;
      local_11f8._0_16_ = auVar91;
      local_1458 = mm_lookupmask_ps._240_8_;
      uStack_1450 = mm_lookupmask_ps._248_8_;
      local_1528 = context;
      local_14d8 = uVar25;
      local_1568 = ray;
LAB_00e63300:
      if (local_14c0 != local_11d8) {
        uVar40 = local_14c0[-1];
        local_14c0 = local_14c0 + -1;
        do {
          fVar149 = (ray->dir).field_0.m128[3];
          auVar47._4_4_ = fVar149;
          auVar47._0_4_ = fVar149;
          auVar47._8_4_ = fVar149;
          auVar47._12_4_ = fVar149;
          auVar47._16_4_ = fVar149;
          auVar47._20_4_ = fVar149;
          auVar47._24_4_ = fVar149;
          auVar47._28_4_ = fVar149;
          do {
            if ((uVar40 & 8) != 0) {
              local_14c8 = (ulong)((uint)uVar40 & 0xf) - 8;
              uVar40 = uVar40 & 0xfffffffffffffff0;
              local_14d0 = 0;
              goto LAB_00e634b1;
            }
            uVar20 = uVar40 & 0xfffffffffffffff0;
            pfVar3 = (float *)(uVar20 + 0x100 + uVar25);
            pfVar1 = (float *)(uVar20 + 0x40 + uVar25);
            auVar60._0_4_ = fVar149 * *pfVar3 + *pfVar1;
            auVar60._4_4_ = fVar149 * pfVar3[1] + pfVar1[1];
            auVar60._8_4_ = fVar149 * pfVar3[2] + pfVar1[2];
            auVar60._12_4_ = fVar149 * pfVar3[3] + pfVar1[3];
            auVar60._16_4_ = fVar149 * pfVar3[4] + pfVar1[4];
            auVar60._20_4_ = fVar149 * pfVar3[5] + pfVar1[5];
            auVar60._24_4_ = fVar149 * pfVar3[6] + pfVar1[6];
            auVar60._28_4_ = auVar61._28_4_ + pfVar1[7];
            auVar60 = vsubps_avx(auVar60,auVar121._0_32_);
            auVar14._4_4_ = auVar143._4_4_ * auVar60._4_4_;
            auVar14._0_4_ = auVar143._0_4_ * auVar60._0_4_;
            auVar14._8_4_ = auVar143._8_4_ * auVar60._8_4_;
            auVar14._12_4_ = auVar143._12_4_ * auVar60._12_4_;
            auVar14._16_4_ = auVar143._16_4_ * auVar60._16_4_;
            auVar14._20_4_ = auVar143._20_4_ * auVar60._20_4_;
            auVar14._24_4_ = auVar143._24_4_ * auVar60._24_4_;
            auVar14._28_4_ = auVar60._28_4_;
            auVar60 = vmaxps_avx(auVar116._0_32_,auVar14);
            pfVar3 = (float *)(uVar20 + 0x100 + uVar38);
            pfVar1 = (float *)(uVar20 + 0x40 + uVar38);
            auVar73._0_4_ = fVar149 * *pfVar3 + *pfVar1;
            auVar73._4_4_ = fVar149 * pfVar3[1] + pfVar1[1];
            auVar73._8_4_ = fVar149 * pfVar3[2] + pfVar1[2];
            auVar73._12_4_ = fVar149 * pfVar3[3] + pfVar1[3];
            auVar73._16_4_ = fVar149 * pfVar3[4] + pfVar1[4];
            auVar73._20_4_ = fVar149 * pfVar3[5] + pfVar1[5];
            auVar73._24_4_ = fVar149 * pfVar3[6] + pfVar1[6];
            auVar73._28_4_ = auVar75._28_4_ + pfVar1[7];
            auVar14 = vsubps_avx(auVar73,auVar135._0_32_);
            auVar13._4_4_ = auVar145._4_4_ * auVar14._4_4_;
            auVar13._0_4_ = auVar145._0_4_ * auVar14._0_4_;
            auVar13._8_4_ = auVar145._8_4_ * auVar14._8_4_;
            auVar13._12_4_ = auVar145._12_4_ * auVar14._12_4_;
            auVar13._16_4_ = auVar145._16_4_ * auVar14._16_4_;
            auVar13._20_4_ = auVar145._20_4_ * auVar14._20_4_;
            auVar13._24_4_ = auVar145._24_4_ * auVar14._24_4_;
            auVar13._28_4_ = auVar14._28_4_;
            pfVar3 = (float *)(uVar20 + 0x100 + uVar31);
            pfVar1 = (float *)(uVar20 + 0x40 + uVar31);
            auVar92._0_4_ = fVar149 * *pfVar3 + *pfVar1;
            auVar92._4_4_ = fVar149 * pfVar3[1] + pfVar1[1];
            auVar92._8_4_ = fVar149 * pfVar3[2] + pfVar1[2];
            auVar92._12_4_ = fVar149 * pfVar3[3] + pfVar1[3];
            auVar92._16_4_ = fVar149 * pfVar3[4] + pfVar1[4];
            auVar92._20_4_ = fVar149 * pfVar3[5] + pfVar1[5];
            auVar92._24_4_ = fVar149 * pfVar3[6] + pfVar1[6];
            auVar92._28_4_ = auVar94._28_4_ + pfVar1[7];
            auVar15 = vsubps_avx(auVar92,auVar142._0_32_);
            auVar16._4_4_ = auVar151._4_4_ * auVar15._4_4_;
            auVar16._0_4_ = auVar151._0_4_ * auVar15._0_4_;
            auVar16._8_4_ = auVar151._8_4_ * auVar15._8_4_;
            auVar16._12_4_ = auVar151._12_4_ * auVar15._12_4_;
            auVar16._16_4_ = auVar151._16_4_ * auVar15._16_4_;
            auVar16._20_4_ = auVar151._20_4_ * auVar15._20_4_;
            auVar16._24_4_ = auVar151._24_4_ * auVar15._24_4_;
            auVar16._28_4_ = auVar15._28_4_;
            auVar14 = vmaxps_avx(auVar13,auVar16);
            auVar60 = vmaxps_avx(auVar60,auVar14);
            pfVar3 = (float *)(uVar20 + 0x100 + uVar39);
            pfVar1 = (float *)(uVar20 + 0x40 + uVar39);
            auVar74._0_4_ = fVar149 * *pfVar3 + *pfVar1;
            auVar74._4_4_ = fVar149 * pfVar3[1] + pfVar1[1];
            auVar74._8_4_ = fVar149 * pfVar3[2] + pfVar1[2];
            auVar74._12_4_ = fVar149 * pfVar3[3] + pfVar1[3];
            auVar74._16_4_ = fVar149 * pfVar3[4] + pfVar1[4];
            auVar74._20_4_ = fVar149 * pfVar3[5] + pfVar1[5];
            auVar74._24_4_ = fVar149 * pfVar3[6] + pfVar1[6];
            auVar74._28_4_ = auVar14._28_4_ + pfVar1[7];
            auVar14 = vsubps_avx(auVar74,auVar121._0_32_);
            auVar17._4_4_ = auVar160._4_4_ * auVar14._4_4_;
            auVar17._0_4_ = auVar160._0_4_ * auVar14._0_4_;
            auVar17._8_4_ = auVar160._8_4_ * auVar14._8_4_;
            auVar17._12_4_ = auVar160._12_4_ * auVar14._12_4_;
            auVar17._16_4_ = auVar160._16_4_ * auVar14._16_4_;
            auVar17._20_4_ = auVar160._20_4_ * auVar14._20_4_;
            auVar17._24_4_ = auVar160._24_4_ * auVar14._24_4_;
            auVar17._28_4_ = auVar14._28_4_;
            pfVar3 = (float *)(uVar20 + 0x100 + (uVar38 ^ 0x20));
            auVar13 = vminps_avx(local_11f8,auVar17);
            pfVar1 = (float *)(uVar20 + 0x40 + (uVar38 ^ 0x20));
            auVar93._0_4_ = fVar149 * *pfVar3 + *pfVar1;
            auVar93._4_4_ = fVar149 * pfVar3[1] + pfVar1[1];
            auVar93._8_4_ = fVar149 * pfVar3[2] + pfVar1[2];
            auVar93._12_4_ = fVar149 * pfVar3[3] + pfVar1[3];
            auVar93._16_4_ = fVar149 * pfVar3[4] + pfVar1[4];
            auVar93._20_4_ = fVar149 * pfVar3[5] + pfVar1[5];
            auVar93._24_4_ = fVar149 * pfVar3[6] + pfVar1[6];
            auVar93._28_4_ = auVar15._28_4_ + pfVar1[7];
            auVar14 = vsubps_avx(auVar93,auVar135._0_32_);
            pfVar3 = (float *)(uVar20 + 0x100 + (uVar31 ^ 0x20));
            pfVar1 = (float *)(uVar20 + 0x40 + (uVar31 ^ 0x20));
            auVar105._0_4_ = fVar149 * *pfVar3 + *pfVar1;
            auVar105._4_4_ = fVar149 * pfVar3[1] + pfVar1[1];
            auVar105._8_4_ = fVar149 * pfVar3[2] + pfVar1[2];
            auVar105._12_4_ = fVar149 * pfVar3[3] + pfVar1[3];
            auVar105._16_4_ = fVar149 * pfVar3[4] + pfVar1[4];
            auVar105._20_4_ = fVar149 * pfVar3[5] + pfVar1[5];
            auVar105._24_4_ = fVar149 * pfVar3[6] + pfVar1[6];
            auVar105._28_4_ = local_11f8._28_4_ + pfVar1[7];
            auVar15._4_4_ = auVar167._4_4_ * auVar14._4_4_;
            auVar15._0_4_ = auVar167._0_4_ * auVar14._0_4_;
            auVar15._8_4_ = auVar167._8_4_ * auVar14._8_4_;
            auVar15._12_4_ = auVar167._12_4_ * auVar14._12_4_;
            auVar15._16_4_ = auVar167._16_4_ * auVar14._16_4_;
            auVar15._20_4_ = auVar167._20_4_ * auVar14._20_4_;
            auVar15._24_4_ = auVar167._24_4_ * auVar14._24_4_;
            auVar15._28_4_ = auVar14._28_4_;
            auVar14 = vsubps_avx(auVar105,auVar142._0_32_);
            auVar18._4_4_ = auVar173._4_4_ * auVar14._4_4_;
            auVar18._0_4_ = auVar173._0_4_ * auVar14._0_4_;
            auVar18._8_4_ = auVar173._8_4_ * auVar14._8_4_;
            auVar18._12_4_ = auVar173._12_4_ * auVar14._12_4_;
            auVar18._16_4_ = auVar173._16_4_ * auVar14._16_4_;
            auVar18._20_4_ = auVar173._20_4_ * auVar14._20_4_;
            auVar18._24_4_ = auVar173._24_4_ * auVar14._24_4_;
            auVar18._28_4_ = auVar14._28_4_;
            auVar14 = vminps_avx(auVar15,auVar18);
            auVar13 = vminps_avx(auVar13,auVar14);
            auVar60 = vcmpps_avx(auVar60,auVar13,2);
            if (((uint)uVar40 & 7) == 6) {
              auVar13 = vcmpps_avx(*(undefined1 (*) [32])(uVar20 + 0x1c0),auVar47,2);
              auVar14 = vcmpps_avx(auVar47,*(undefined1 (*) [32])(uVar20 + 0x1e0),1);
              auVar13 = vandps_avx(auVar13,auVar14);
              auVar60 = vandps_avx(auVar13,auVar60);
            }
            auVar94 = ZEXT3264(auVar14);
            auVar91 = vpackssdw_avx(auVar60._0_16_,auVar60._16_16_);
            auVar51 = vpsllw_avx(auVar91,0xf);
            auVar61 = ZEXT1664(auVar51);
            auVar91 = vpacksswb_avx(auVar51,auVar51);
            auVar75 = ZEXT1664(auVar91);
            bVar21 = SUB161(auVar91 >> 7,0) & 1 | (SUB161(auVar91 >> 0xf,0) & 1) << 1 |
                     (SUB161(auVar91 >> 0x17,0) & 1) << 2 | (SUB161(auVar91 >> 0x1f,0) & 1) << 3 |
                     (SUB161(auVar91 >> 0x27,0) & 1) << 4 | (SUB161(auVar91 >> 0x2f,0) & 1) << 5 |
                     (SUB161(auVar91 >> 0x37,0) & 1) << 6 | SUB161(auVar91 >> 0x3f,0) << 7;
            if ((((((((auVar51 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar51 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar51 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar51 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar51 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar51 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar51 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar51[0xf]) goto LAB_00e63300;
            lVar7 = 0;
            if (bVar21 != 0) {
              for (; (bVar21 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
              }
            }
            uVar40 = *(ulong *)(uVar20 + lVar7 * 8);
            uVar22 = bVar21 - 1 & (uint)bVar21;
            uVar23 = (ulong)uVar22;
          } while (uVar22 == 0);
          do {
            *local_14c0 = uVar40;
            local_14c0 = local_14c0 + 1;
            lVar7 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
              }
            }
            uVar40 = *(ulong *)(uVar20 + lVar7 * 8);
            uVar23 = uVar23 - 1 & uVar23;
          } while (uVar23 != 0);
        } while( true );
      }
    }
  }
  return;
LAB_00e634b1:
  if (local_14d0 == local_14c8) goto LAB_00e63300;
  lVar37 = local_14d0 * 0x50;
  pSVar30 = context->scene;
  local_1520 = pSVar30;
  pGVar6 = (pSVar30->geometries).items[*(uint *)(uVar40 + 0x30 + lVar37)].ptr;
  fVar149 = (pGVar6->time_range).lower;
  fVar149 = pGVar6->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar149) / ((pGVar6->time_range).upper - fVar149));
  auVar91 = vroundss_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar149),9);
  auVar91 = vminss_avx(auVar91,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
  auVar54 = vmaxss_avx(auVar128._0_16_,auVar91);
  lVar24 = (long)(int)auVar54._0_4_ * 0x38;
  uVar34 = (ulong)*(uint *)(uVar40 + 4 + lVar37);
  lVar7 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar24);
  lVar24 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar24);
  auVar91 = *(undefined1 (*) [16])(lVar7 + (ulong)*(uint *)(uVar40 + lVar37) * 4);
  uVar32 = (ulong)*(uint *)(uVar40 + 0x10 + lVar37);
  auVar51 = *(undefined1 (*) [16])(lVar7 + uVar32 * 4);
  uVar23 = (ulong)*(uint *)(uVar40 + 0x20 + lVar37);
  auVar84 = *(undefined1 (*) [16])(lVar7 + uVar23 * 4);
  auVar12 = *(undefined1 (*) [16])(lVar7 + uVar34 * 4);
  uVar26 = (ulong)*(uint *)(uVar40 + 0x14 + lVar37);
  auVar100 = *(undefined1 (*) [16])(lVar7 + uVar26 * 4);
  uVar27 = (ulong)*(uint *)(uVar40 + 0x24 + lVar37);
  auVar85 = *(undefined1 (*) [16])(lVar7 + uVar27 * 4);
  uVar35 = (ulong)*(uint *)(uVar40 + 8 + lVar37);
  auVar66 = *(undefined1 (*) [16])(lVar7 + uVar35 * 4);
  uVar25 = (ulong)*(uint *)(uVar40 + 0x18 + lVar37);
  auVar82 = *(undefined1 (*) [16])(lVar7 + uVar25 * 4);
  uVar28 = (ulong)*(uint *)(uVar40 + 0x28 + lVar37);
  auVar101 = *(undefined1 (*) [16])(lVar7 + uVar28 * 4);
  uVar29 = (ulong)*(uint *)(uVar40 + 0xc + lVar37);
  auVar41 = *(undefined1 (*) [16])(lVar7 + uVar29 * 4);
  uVar33 = (ulong)*(uint *)(uVar40 + 0x1c + lVar37);
  auVar42 = *(undefined1 (*) [16])(lVar7 + uVar33 * 4);
  uVar20 = (ulong)*(uint *)(uVar40 + 0x2c + lVar37);
  auVar43 = *(undefined1 (*) [16])(lVar7 + uVar20 * 4);
  auVar52 = *(undefined1 (*) [16])(lVar24 + (ulong)*(uint *)(uVar40 + lVar37) * 4);
  auVar53 = *(undefined1 (*) [16])(lVar24 + uVar32 * 4);
  fVar149 = fVar149 - auVar54._0_4_;
  auVar54 = vunpcklps_avx(auVar91,auVar66);
  auVar66 = vunpckhps_avx(auVar91,auVar66);
  auVar67 = vunpcklps_avx(auVar12,auVar41);
  auVar12 = vunpckhps_avx(auVar12,auVar41);
  auVar91 = *(undefined1 (*) [16])(lVar24 + uVar34 * 4);
  auVar68 = vunpcklps_avx(auVar66,auVar12);
  auVar83 = vunpcklps_avx(auVar54,auVar67);
  auVar66 = vunpckhps_avx(auVar54,auVar67);
  auVar41 = vunpcklps_avx(auVar51,auVar82);
  auVar12 = vunpckhps_avx(auVar51,auVar82);
  auVar82 = vunpcklps_avx(auVar100,auVar42);
  auVar100 = vunpckhps_avx(auVar100,auVar42);
  auVar51 = *(undefined1 (*) [16])(lVar24 + uVar35 * 4);
  auVar42 = vunpcklps_avx(auVar12,auVar100);
  auVar54 = vunpcklps_avx(auVar41,auVar82);
  auVar100 = vunpckhps_avx(auVar41,auVar82);
  auVar41 = vunpcklps_avx(auVar84,auVar101);
  auVar82 = vunpckhps_avx(auVar84,auVar101);
  auVar67 = vunpcklps_avx(auVar85,auVar43);
  auVar101 = vunpckhps_avx(auVar85,auVar43);
  auVar12 = *(undefined1 (*) [16])(lVar24 + uVar29 * 4);
  auVar43 = vunpcklps_avx(auVar82,auVar101);
  auVar84 = vunpcklps_avx(auVar41,auVar67);
  auVar82 = vunpckhps_avx(auVar41,auVar67);
  auVar101 = vunpcklps_avx(auVar52,auVar51);
  auVar51 = vunpckhps_avx(auVar52,auVar51);
  auVar41 = vunpcklps_avx(auVar91,auVar12);
  auVar12 = vunpckhps_avx(auVar91,auVar12);
  auVar91 = *(undefined1 (*) [16])(lVar24 + uVar25 * 4);
  auVar52 = vunpcklps_avx(auVar51,auVar12);
  auVar67 = vunpcklps_avx(auVar101,auVar41);
  auVar12 = vunpckhps_avx(auVar101,auVar41);
  auVar41 = vunpcklps_avx(auVar53,auVar91);
  auVar101 = vunpckhps_avx(auVar53,auVar91);
  auVar91 = *(undefined1 (*) [16])(lVar24 + uVar26 * 4);
  auVar51 = *(undefined1 (*) [16])(lVar24 + uVar33 * 4);
  auVar53 = vunpcklps_avx(auVar91,auVar51);
  auVar91 = vunpckhps_avx(auVar91,auVar51);
  auVar85 = vunpcklps_avx(auVar101,auVar91);
  auVar86 = vunpcklps_avx(auVar41,auVar53);
  auVar101 = vunpckhps_avx(auVar41,auVar53);
  auVar91 = *(undefined1 (*) [16])(lVar24 + uVar23 * 4);
  auVar51 = *(undefined1 (*) [16])(lVar24 + uVar28 * 4);
  auVar53 = vunpcklps_avx(auVar91,auVar51);
  auVar41 = vunpckhps_avx(auVar91,auVar51);
  auVar91 = *(undefined1 (*) [16])(lVar24 + uVar27 * 4);
  auVar51 = *(undefined1 (*) [16])(lVar24 + uVar20 * 4);
  auVar102 = vunpcklps_avx(auVar91,auVar51);
  auVar91 = vunpckhps_avx(auVar91,auVar51);
  auVar103 = vunpcklps_avx(auVar41,auVar91);
  auVar104 = vunpcklps_avx(auVar53,auVar102);
  auVar41 = vunpckhps_avx(auVar53,auVar102);
  auVar91 = vshufps_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar149),0);
  auVar51 = vshufps_avx(ZEXT416((uint)(1.0 - fVar149)),ZEXT416((uint)(1.0 - fVar149)),0);
  fVar76 = auVar91._0_4_;
  fVar77 = auVar91._4_4_;
  fVar80 = auVar91._8_4_;
  fVar176 = auVar91._12_4_;
  fVar149 = auVar51._0_4_;
  fVar152 = auVar51._4_4_;
  fVar154 = auVar51._8_4_;
  fVar156 = auVar51._12_4_;
  auVar117._0_4_ = fVar149 * auVar83._0_4_ + fVar76 * auVar67._0_4_;
  auVar117._4_4_ = fVar152 * auVar83._4_4_ + fVar77 * auVar67._4_4_;
  auVar117._8_4_ = fVar154 * auVar83._8_4_ + fVar80 * auVar67._8_4_;
  auVar117._12_4_ = fVar156 * auVar83._12_4_ + fVar176 * auVar67._12_4_;
  auVar122._0_4_ = fVar149 * auVar66._0_4_ + fVar76 * auVar12._0_4_;
  auVar122._4_4_ = fVar152 * auVar66._4_4_ + fVar77 * auVar12._4_4_;
  auVar122._8_4_ = fVar154 * auVar66._8_4_ + fVar80 * auVar12._8_4_;
  auVar122._12_4_ = fVar156 * auVar66._12_4_ + fVar176 * auVar12._12_4_;
  local_1518._0_4_ = auVar68._0_4_;
  local_1518._4_4_ = auVar68._4_4_;
  fStack_1510 = auVar68._8_4_;
  fStack_150c = auVar68._12_4_;
  auVar102._0_4_ = fVar149 * (float)local_1518._0_4_ + fVar76 * auVar52._0_4_;
  auVar102._4_4_ = fVar152 * (float)local_1518._4_4_ + fVar77 * auVar52._4_4_;
  auVar102._8_4_ = fVar154 * fStack_1510 + fVar80 * auVar52._8_4_;
  auVar102._12_4_ = fVar156 * fStack_150c + fVar176 * auVar52._12_4_;
  auVar130._0_4_ = fVar149 * auVar54._0_4_ + fVar76 * auVar86._0_4_;
  auVar130._4_4_ = fVar152 * auVar54._4_4_ + fVar77 * auVar86._4_4_;
  auVar130._8_4_ = fVar154 * auVar54._8_4_ + fVar80 * auVar86._8_4_;
  auVar130._12_4_ = fVar156 * auVar54._12_4_ + fVar176 * auVar86._12_4_;
  auVar112._0_4_ = fVar149 * auVar100._0_4_ + fVar76 * auVar101._0_4_;
  auVar112._4_4_ = fVar152 * auVar100._4_4_ + fVar77 * auVar101._4_4_;
  auVar112._8_4_ = fVar154 * auVar100._8_4_ + fVar80 * auVar101._8_4_;
  auVar112._12_4_ = fVar156 * auVar100._12_4_ + fVar176 * auVar101._12_4_;
  puVar2 = (undefined8 *)(uVar40 + 0x30 + lVar37);
  local_13f8 = *puVar2;
  uStack_13f0 = puVar2[1];
  puVar2 = (undefined8 *)(uVar40 + 0x40 + lVar37);
  local_15a8._0_4_ = auVar42._0_4_;
  local_15a8._4_4_ = auVar42._4_4_;
  fStack_15a0 = auVar42._8_4_;
  fStack_159c = auVar42._12_4_;
  auVar52._0_4_ = fVar149 * (float)local_15a8._0_4_ + fVar76 * auVar85._0_4_;
  auVar52._4_4_ = fVar152 * (float)local_15a8._4_4_ + fVar77 * auVar85._4_4_;
  auVar52._8_4_ = fVar154 * fStack_15a0 + fVar80 * auVar85._8_4_;
  auVar52._12_4_ = fVar156 * fStack_159c + fVar176 * auVar85._12_4_;
  local_14e8._0_4_ = auVar84._0_4_;
  local_14e8._4_4_ = auVar84._4_4_;
  fStack_14e0 = auVar84._8_4_;
  fStack_14dc = auVar84._12_4_;
  auVar67._0_4_ = fVar149 * (float)local_14e8._0_4_ + fVar76 * auVar104._0_4_;
  auVar67._4_4_ = fVar152 * (float)local_14e8._4_4_ + fVar77 * auVar104._4_4_;
  auVar67._8_4_ = fVar154 * fStack_14e0 + fVar80 * auVar104._8_4_;
  auVar67._12_4_ = fVar156 * fStack_14dc + fVar176 * auVar104._12_4_;
  local_1548._0_4_ = auVar82._0_4_;
  local_1548._4_4_ = auVar82._4_4_;
  fStack_1540 = auVar82._8_4_;
  fStack_153c = auVar82._12_4_;
  auVar172._0_4_ = fVar149 * (float)local_1548._0_4_ + fVar76 * auVar41._0_4_;
  auVar172._4_4_ = fVar152 * (float)local_1548._4_4_ + fVar77 * auVar41._4_4_;
  auVar172._8_4_ = fVar154 * fStack_1540 + fVar80 * auVar41._8_4_;
  auVar172._12_4_ = fVar156 * fStack_153c + fVar176 * auVar41._12_4_;
  local_1538._0_4_ = auVar43._0_4_;
  local_1538._4_4_ = auVar43._4_4_;
  fStack_1530 = auVar43._8_4_;
  fStack_152c = auVar43._12_4_;
  auVar139._0_4_ = fVar76 * auVar103._0_4_ + fVar149 * (float)local_1538._0_4_;
  auVar139._4_4_ = fVar77 * auVar103._4_4_ + fVar152 * (float)local_1538._4_4_;
  auVar139._8_4_ = fVar80 * auVar103._8_4_ + fVar154 * fStack_1530;
  auVar139._12_4_ = fVar176 * auVar103._12_4_ + fVar156 * fStack_152c;
  local_1408 = *puVar2;
  uStack_1400 = puVar2[1];
  uVar4 = *(undefined4 *)&(local_1568->org).field_0;
  auVar41._4_4_ = uVar4;
  auVar41._0_4_ = uVar4;
  auVar41._8_4_ = uVar4;
  auVar41._12_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(local_1568->org).field_0 + 4);
  auVar159._4_4_ = uVar4;
  auVar159._0_4_ = uVar4;
  auVar159._8_4_ = uVar4;
  auVar159._12_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(local_1568->org).field_0 + 8);
  auVar165._4_4_ = uVar4;
  auVar165._0_4_ = uVar4;
  auVar165._8_4_ = uVar4;
  auVar165._12_4_ = uVar4;
  _local_15a8 = vsubps_avx(auVar117,auVar41);
  _local_1538 = vsubps_avx(auVar122,auVar159);
  _local_1548 = vsubps_avx(auVar102,auVar165);
  auVar91 = vsubps_avx(auVar130,auVar41);
  auVar51 = vsubps_avx(auVar112,auVar159);
  auVar12 = vsubps_avx(auVar52,auVar165);
  auVar100 = vsubps_avx(auVar67,auVar41);
  auVar66 = vsubps_avx(auVar172,auVar159);
  auVar82 = vsubps_avx(auVar139,auVar165);
  _local_14e8 = vsubps_avx(auVar100,_local_15a8);
  local_14f8 = vsubps_avx(auVar66,_local_1538);
  local_1508 = vsubps_avx(auVar82,_local_1548);
  fVar149 = local_1538._0_4_;
  fVar50 = auVar66._0_4_ + fVar149;
  fVar156 = local_1538._4_4_;
  fVar62 = auVar66._4_4_ + fVar156;
  fVar80 = local_1538._8_4_;
  fVar63 = auVar66._8_4_ + fVar80;
  fVar9 = local_1538._12_4_;
  fVar64 = auVar66._12_4_ + fVar9;
  fVar152 = local_1548._0_4_;
  fVar98 = auVar82._0_4_ + fVar152;
  fVar76 = local_1548._4_4_;
  fVar106 = auVar82._4_4_ + fVar76;
  fVar176 = local_1548._8_4_;
  fVar108 = auVar82._8_4_ + fVar176;
  fVar10 = local_1548._12_4_;
  fVar110 = auVar82._12_4_ + fVar10;
  fVar65 = local_1508._0_4_;
  auVar131._0_4_ = fVar65 * fVar50;
  fVar79 = local_1508._4_4_;
  auVar131._4_4_ = fVar79 * fVar62;
  fVar48 = local_1508._8_4_;
  auVar131._8_4_ = fVar48 * fVar63;
  fVar49 = local_1508._12_4_;
  auVar131._12_4_ = fVar49 * fVar64;
  fVar171 = local_14f8._0_4_;
  auVar140._0_4_ = fVar171 * fVar98;
  fVar174 = local_14f8._4_4_;
  auVar140._4_4_ = fVar174 * fVar106;
  fVar175 = local_14f8._8_4_;
  auVar140._8_4_ = fVar175 * fVar108;
  fVar177 = local_14f8._12_4_;
  auVar140._12_4_ = fVar177 * fVar110;
  auVar101 = vsubps_avx(auVar140,auVar131);
  fVar154 = local_15a8._0_4_;
  fVar129 = auVar100._0_4_ + fVar154;
  fVar77 = local_15a8._4_4_;
  fVar136 = auVar100._4_4_ + fVar77;
  fVar8 = local_15a8._8_4_;
  fVar137 = auVar100._8_4_ + fVar8;
  fVar11 = local_15a8._12_4_;
  fVar138 = auVar100._12_4_ + fVar11;
  fVar164 = local_14e8._0_4_;
  auVar103._0_4_ = fVar164 * fVar98;
  fVar168 = local_14e8._4_4_;
  auVar103._4_4_ = fVar168 * fVar106;
  fVar169 = local_14e8._8_4_;
  auVar103._8_4_ = fVar169 * fVar108;
  fVar170 = local_14e8._12_4_;
  auVar103._12_4_ = fVar170 * fVar110;
  auVar141._0_4_ = fVar129 * fVar65;
  auVar141._4_4_ = fVar136 * fVar79;
  auVar141._8_4_ = fVar137 * fVar48;
  auVar141._12_4_ = fVar138 * fVar49;
  auVar41 = vsubps_avx(auVar141,auVar103);
  auVar132._0_4_ = fVar171 * fVar129;
  auVar132._4_4_ = fVar174 * fVar136;
  auVar132._8_4_ = fVar175 * fVar137;
  auVar132._12_4_ = fVar177 * fVar138;
  auVar42._0_4_ = fVar164 * fVar50;
  auVar42._4_4_ = fVar168 * fVar62;
  auVar42._8_4_ = fVar169 * fVar63;
  auVar42._12_4_ = fVar170 * fVar64;
  auVar42 = vsubps_avx(auVar42,auVar132);
  fStack_1584 = (local_1568->dir).field_0.m128[2];
  local_1578._4_4_ = (local_1568->dir).field_0.m128[1];
  fStack_1550 = (local_1568->dir).field_0.m128[0];
  local_1558 = CONCAT44(fStack_1550,fStack_1550);
  fStack_154c = fStack_1550;
  local_1598._0_4_ =
       auVar101._0_4_ * fStack_1550 + local_1578._4_4_ * auVar41._0_4_ + fStack_1584 * auVar42._0_4_
  ;
  local_1598._4_4_ =
       auVar101._4_4_ * fStack_1550 + local_1578._4_4_ * auVar41._4_4_ + fStack_1584 * auVar42._4_4_
  ;
  local_1598._8_4_ =
       auVar101._8_4_ * fStack_1550 + local_1578._4_4_ * auVar41._8_4_ + fStack_1584 * auVar42._8_4_
  ;
  local_1598._12_4_ =
       auVar101._12_4_ * fStack_1550 +
       local_1578._4_4_ * auVar41._12_4_ + fStack_1584 * auVar42._12_4_;
  _local_1518 = vsubps_avx(_local_1538,auVar51);
  local_1428 = vsubps_avx(_local_1548,auVar12);
  fVar62 = fVar149 + auVar51._0_4_;
  fVar64 = fVar156 + auVar51._4_4_;
  fVar106 = fVar80 + auVar51._8_4_;
  fVar110 = fVar9 + auVar51._12_4_;
  fVar129 = fVar152 + auVar12._0_4_;
  fVar136 = fVar76 + auVar12._4_4_;
  fVar137 = fVar176 + auVar12._8_4_;
  fVar138 = fVar10 + auVar12._12_4_;
  fVar50 = local_1428._0_4_;
  auVar166._0_4_ = fVar50 * fVar62;
  fVar63 = local_1428._4_4_;
  auVar166._4_4_ = fVar63 * fVar64;
  fVar98 = local_1428._8_4_;
  auVar166._8_4_ = fVar98 * fVar106;
  fVar108 = local_1428._12_4_;
  auVar166._12_4_ = fVar108 * fVar110;
  fVar158 = local_1518._0_4_;
  auVar83._0_4_ = fVar158 * fVar129;
  fVar161 = local_1518._4_4_;
  auVar83._4_4_ = fVar161 * fVar136;
  fVar162 = local_1518._8_4_;
  auVar83._8_4_ = fVar162 * fVar137;
  fVar163 = local_1518._12_4_;
  auVar83._12_4_ = fVar163 * fVar138;
  auVar101 = vsubps_avx(auVar83,auVar166);
  local_1418 = vsubps_avx(_local_15a8,auVar91);
  fVar144 = local_1418._0_4_;
  auVar104._0_4_ = fVar144 * fVar129;
  fVar146 = local_1418._4_4_;
  auVar104._4_4_ = fVar146 * fVar136;
  fVar147 = local_1418._8_4_;
  auVar104._8_4_ = fVar147 * fVar137;
  fVar148 = local_1418._12_4_;
  auVar104._12_4_ = fVar148 * fVar138;
  fVar129 = fVar154 + auVar91._0_4_;
  fVar136 = fVar77 + auVar91._4_4_;
  fVar137 = fVar8 + auVar91._8_4_;
  fVar138 = fVar11 + auVar91._12_4_;
  auVar133._0_4_ = fVar50 * fVar129;
  auVar133._4_4_ = fVar63 * fVar136;
  auVar133._8_4_ = fVar98 * fVar137;
  auVar133._12_4_ = fVar108 * fVar138;
  auVar41 = vsubps_avx(auVar133,auVar104);
  auVar123._0_4_ = fVar158 * fVar129;
  auVar123._4_4_ = fVar161 * fVar136;
  auVar123._8_4_ = fVar162 * fVar137;
  auVar123._12_4_ = fVar163 * fVar138;
  auVar43._0_4_ = fVar144 * fVar62;
  auVar43._4_4_ = fVar146 * fVar64;
  auVar43._8_4_ = fVar147 * fVar106;
  auVar43._12_4_ = fVar148 * fVar110;
  auVar42 = vsubps_avx(auVar43,auVar123);
  local_13d8._0_4_ =
       fStack_1550 * auVar101._0_4_ + local_1578._4_4_ * auVar41._0_4_ + fStack_1584 * auVar42._0_4_
  ;
  local_13d8._4_4_ =
       fStack_1550 * auVar101._4_4_ + local_1578._4_4_ * auVar41._4_4_ + fStack_1584 * auVar42._4_4_
  ;
  local_13d8._8_4_ =
       fStack_1550 * auVar101._8_4_ + local_1578._4_4_ * auVar41._8_4_ + fStack_1584 * auVar42._8_4_
  ;
  local_13d8._12_4_ =
       fStack_1550 * auVar101._12_4_ +
       local_1578._4_4_ * auVar41._12_4_ + fStack_1584 * auVar42._12_4_;
  auVar101 = vsubps_avx(auVar91,auVar100);
  fVar81 = auVar91._0_4_ + auVar100._0_4_;
  fVar95 = auVar91._4_4_ + auVar100._4_4_;
  fVar96 = auVar91._8_4_ + auVar100._8_4_;
  fVar97 = auVar91._12_4_ + auVar100._12_4_;
  auVar91 = vsubps_avx(auVar51,auVar66);
  fVar136 = auVar51._0_4_ + auVar66._0_4_;
  fVar137 = auVar51._4_4_ + auVar66._4_4_;
  fVar138 = auVar51._8_4_ + auVar66._8_4_;
  fVar78 = auVar51._12_4_ + auVar66._12_4_;
  auVar51 = vsubps_avx(auVar12,auVar82);
  fVar64 = auVar12._0_4_ + auVar82._0_4_;
  fVar106 = auVar12._4_4_ + auVar82._4_4_;
  fVar110 = auVar12._8_4_ + auVar82._8_4_;
  fVar129 = auVar12._12_4_ + auVar82._12_4_;
  fVar99 = auVar51._0_4_;
  auVar113._0_4_ = fVar99 * fVar136;
  fVar107 = auVar51._4_4_;
  auVar113._4_4_ = fVar107 * fVar137;
  fVar109 = auVar51._8_4_;
  auVar113._8_4_ = fVar109 * fVar138;
  fVar111 = auVar51._12_4_;
  auVar113._12_4_ = fVar111 * fVar78;
  fVar150 = auVar91._0_4_;
  auVar124._0_4_ = fVar150 * fVar64;
  fVar153 = auVar91._4_4_;
  auVar124._4_4_ = fVar153 * fVar106;
  fVar155 = auVar91._8_4_;
  auVar124._8_4_ = fVar155 * fVar110;
  fVar157 = auVar91._12_4_;
  auVar124._12_4_ = fVar157 * fVar129;
  auVar91 = vsubps_avx(auVar124,auVar113);
  fVar62 = auVar101._0_4_;
  auVar53._0_4_ = fVar62 * fVar64;
  fVar64 = auVar101._4_4_;
  auVar53._4_4_ = fVar64 * fVar106;
  fVar106 = auVar101._8_4_;
  auVar53._8_4_ = fVar106 * fVar110;
  fVar110 = auVar101._12_4_;
  auVar53._12_4_ = fVar110 * fVar129;
  auVar125._0_4_ = fVar99 * fVar81;
  auVar125._4_4_ = fVar107 * fVar95;
  auVar125._8_4_ = fVar109 * fVar96;
  auVar125._12_4_ = fVar111 * fVar97;
  auVar51 = vsubps_avx(auVar125,auVar53);
  auVar84._0_4_ = fVar150 * fVar81;
  auVar84._4_4_ = fVar153 * fVar95;
  auVar84._8_4_ = fVar155 * fVar96;
  auVar84._12_4_ = fVar157 * fVar97;
  auVar68._0_4_ = fVar62 * fVar136;
  auVar68._4_4_ = fVar64 * fVar137;
  auVar68._8_4_ = fVar106 * fVar138;
  auVar68._12_4_ = fVar110 * fVar78;
  auVar12 = vsubps_avx(auVar68,auVar84);
  local_1588 = fStack_1584;
  fStack_1580 = fStack_1584;
  fStack_157c = fStack_1584;
  local_1578._0_4_ = local_1578._4_4_;
  fStack_1570 = local_1578._4_4_;
  fStack_156c = local_1578._4_4_;
  auVar54._0_4_ =
       fStack_1550 * auVar91._0_4_ + local_1578._4_4_ * auVar51._0_4_ + fStack_1584 * auVar12._0_4_;
  auVar54._4_4_ =
       fStack_1550 * auVar91._4_4_ + local_1578._4_4_ * auVar51._4_4_ + fStack_1584 * auVar12._4_4_;
  auVar54._8_4_ =
       fStack_1550 * auVar91._8_4_ + local_1578._4_4_ * auVar51._8_4_ + fStack_1584 * auVar12._8_4_;
  auVar54._12_4_ =
       fStack_1550 * auVar91._12_4_ +
       local_1578._4_4_ * auVar51._12_4_ + fStack_1584 * auVar12._12_4_;
  local_13c8._0_4_ = auVar54._0_4_ + local_1598._0_4_ + local_13d8._0_4_;
  local_13c8._4_4_ = auVar54._4_4_ + local_1598._4_4_ + local_13d8._4_4_;
  local_13c8._8_4_ = auVar54._8_4_ + local_1598._8_4_ + local_13d8._8_4_;
  local_13c8._12_4_ = auVar54._12_4_ + local_1598._12_4_ + local_13d8._12_4_;
  auVar91 = vminps_avx(local_1598,local_13d8);
  auVar91 = vminps_avx(auVar91,auVar54);
  auVar85._8_4_ = 0x7fffffff;
  auVar85._0_8_ = 0x7fffffff7fffffff;
  auVar85._12_4_ = 0x7fffffff;
  local_1438 = vandps_avx(local_13c8,auVar85);
  auVar86._0_4_ = local_1438._0_4_ * 1.1920929e-07;
  auVar86._4_4_ = local_1438._4_4_ * 1.1920929e-07;
  auVar86._8_4_ = local_1438._8_4_ * 1.1920929e-07;
  auVar86._12_4_ = local_1438._12_4_ * 1.1920929e-07;
  auVar94 = ZEXT1664(auVar86);
  uVar25 = CONCAT44(auVar86._4_4_,auVar86._0_4_);
  auVar114._0_8_ = uVar25 ^ 0x8000000080000000;
  auVar114._8_4_ = -auVar86._8_4_;
  auVar114._12_4_ = -auVar86._12_4_;
  auVar91 = vcmpps_avx(auVar91,auVar114,5);
  auVar75 = ZEXT1664(auVar91);
  auVar51 = vmaxps_avx(local_1598,local_13d8);
  auVar51 = vmaxps_avx(auVar51,auVar54);
  auVar51 = vcmpps_avx(auVar51,auVar86,2);
  local_1448 = vorps_avx(auVar91,auVar51);
  auVar61 = ZEXT1664(local_1448);
  local_15a9 = 0;
  auVar12._8_8_ = uStack_1450;
  auVar12._0_8_ = local_1458;
  auVar12 = auVar12 & local_1448;
  ray = local_1568;
  if ((((auVar12 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar12 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar12 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar12[0xf] < '\0') {
    auVar55._0_4_ = fVar158 * fVar65;
    auVar55._4_4_ = fVar161 * fVar79;
    auVar55._8_4_ = fVar162 * fVar48;
    auVar55._12_4_ = fVar163 * fVar49;
    auVar69._0_4_ = fVar171 * fVar50;
    auVar69._4_4_ = fVar174 * fVar63;
    auVar69._8_4_ = fVar175 * fVar98;
    auVar69._12_4_ = fVar177 * fVar108;
    auVar12 = vsubps_avx(auVar69,auVar55);
    auVar87._0_4_ = fVar50 * fVar150;
    auVar87._4_4_ = fVar63 * fVar153;
    auVar87._8_4_ = fVar98 * fVar155;
    auVar87._12_4_ = fVar108 * fVar157;
    auVar115._0_4_ = fVar158 * fVar99;
    auVar115._4_4_ = fVar161 * fVar107;
    auVar115._8_4_ = fVar162 * fVar109;
    auVar115._12_4_ = fVar163 * fVar111;
    auVar100 = vsubps_avx(auVar115,auVar87);
    auVar91 = vandps_avx(auVar85,auVar55);
    auVar51 = vandps_avx(auVar85,auVar87);
    auVar91 = vcmpps_avx(auVar91,auVar51,1);
    local_1368 = vblendvps_avx(auVar100,auVar12,auVar91);
    auVar56._0_4_ = fVar144 * fVar99;
    auVar56._4_4_ = fVar146 * fVar107;
    auVar56._8_4_ = fVar147 * fVar109;
    auVar56._12_4_ = fVar148 * fVar111;
    auVar70._0_4_ = fVar144 * fVar65;
    auVar70._4_4_ = fVar146 * fVar79;
    auVar70._8_4_ = fVar147 * fVar48;
    auVar70._12_4_ = fVar148 * fVar49;
    auVar88._0_4_ = fVar50 * fVar164;
    auVar88._4_4_ = fVar63 * fVar168;
    auVar88._8_4_ = fVar98 * fVar169;
    auVar88._12_4_ = fVar108 * fVar170;
    auVar12 = vsubps_avx(auVar70,auVar88);
    auVar118._0_4_ = fVar50 * fVar62;
    auVar118._4_4_ = fVar63 * fVar64;
    auVar118._8_4_ = fVar98 * fVar106;
    auVar118._12_4_ = fVar108 * fVar110;
    auVar100 = vsubps_avx(auVar118,auVar56);
    auVar91 = vandps_avx(auVar85,auVar88);
    auVar51 = vandps_avx(auVar85,auVar56);
    auVar91 = vcmpps_avx(auVar91,auVar51,1);
    local_1358 = vblendvps_avx(auVar100,auVar12,auVar91);
    auVar61 = ZEXT1664(local_1358);
    auVar44._0_4_ = fVar158 * fVar62;
    auVar44._4_4_ = fVar161 * fVar64;
    auVar44._8_4_ = fVar162 * fVar106;
    auVar44._12_4_ = fVar163 * fVar110;
    auVar71._0_4_ = fVar158 * fVar164;
    auVar71._4_4_ = fVar161 * fVar168;
    auVar71._8_4_ = fVar162 * fVar169;
    auVar71._12_4_ = fVar163 * fVar170;
    auVar89._0_4_ = fVar171 * fVar144;
    auVar89._4_4_ = fVar174 * fVar146;
    auVar89._8_4_ = fVar175 * fVar147;
    auVar89._12_4_ = fVar177 * fVar148;
    auVar119._0_4_ = fVar144 * fVar150;
    auVar119._4_4_ = fVar146 * fVar153;
    auVar119._8_4_ = fVar147 * fVar155;
    auVar119._12_4_ = fVar148 * fVar157;
    auVar12 = vsubps_avx(auVar71,auVar89);
    auVar100 = vsubps_avx(auVar119,auVar44);
    auVar91 = vandps_avx(auVar85,auVar89);
    auVar51 = vandps_avx(auVar85,auVar44);
    auVar91 = vcmpps_avx(auVar91,auVar51,1);
    local_1348 = vblendvps_avx(auVar100,auVar12,auVar91);
    fVar65 = local_1368._0_4_ * fStack_1550 +
             local_1358._0_4_ * local_1578._4_4_ + local_1348._0_4_ * fStack_1584;
    fVar50 = local_1368._4_4_ * fStack_1550 +
             local_1358._4_4_ * local_1578._4_4_ + local_1348._4_4_ * fStack_1584;
    fVar62 = local_1368._8_4_ * fStack_1550 +
             local_1358._8_4_ * local_1578._4_4_ + local_1348._8_4_ * fStack_1584;
    fVar79 = local_1368._12_4_ * fStack_1550 +
             local_1358._12_4_ * local_1578._4_4_ + local_1348._12_4_ * fStack_1584;
    auVar90._0_4_ = fVar65 + fVar65;
    auVar90._4_4_ = fVar50 + fVar50;
    auVar90._8_4_ = fVar62 + fVar62;
    auVar90._12_4_ = fVar79 + fVar79;
    fVar65 = local_1368._0_4_ * fVar154 + local_1358._0_4_ * fVar149 + local_1348._0_4_ * fVar152;
    fVar76 = local_1368._4_4_ * fVar77 + local_1358._4_4_ * fVar156 + local_1348._4_4_ * fVar76;
    fVar77 = local_1368._8_4_ * fVar8 + local_1358._8_4_ * fVar80 + local_1348._8_4_ * fVar176;
    fVar80 = local_1368._12_4_ * fVar11 + local_1358._12_4_ * fVar9 + local_1348._12_4_ * fVar10;
    auVar91 = vrcpps_avx(auVar90);
    fVar149 = auVar91._0_4_;
    auVar126._0_4_ = auVar90._0_4_ * fVar149;
    fVar152 = auVar91._4_4_;
    auVar126._4_4_ = auVar90._4_4_ * fVar152;
    fVar154 = auVar91._8_4_;
    auVar126._8_4_ = auVar90._8_4_ * fVar154;
    fVar156 = auVar91._12_4_;
    auVar126._12_4_ = auVar90._12_4_ * fVar156;
    auVar134._8_4_ = 0x3f800000;
    auVar134._0_8_ = 0x3f8000003f800000;
    auVar134._12_4_ = 0x3f800000;
    auVar91 = vsubps_avx(auVar134,auVar126);
    local_1378._0_4_ = (fVar65 + fVar65) * (fVar149 + fVar149 * auVar91._0_4_);
    local_1378._4_4_ = (fVar76 + fVar76) * (fVar152 + fVar152 * auVar91._4_4_);
    local_1378._8_4_ = (fVar77 + fVar77) * (fVar154 + fVar154 * auVar91._8_4_);
    local_1378._12_4_ = (fVar80 + fVar80) * (fVar156 + fVar156 * auVar91._12_4_);
    auVar75 = ZEXT1664(local_1378);
    uVar4 = *(undefined4 *)((long)&(local_1568->org).field_0 + 0xc);
    auVar120._4_4_ = uVar4;
    auVar120._0_4_ = uVar4;
    auVar120._8_4_ = uVar4;
    auVar120._12_4_ = uVar4;
    auVar91 = vcmpps_avx(auVar120,local_1378,2);
    fVar149 = local_1568->tfar;
    auVar127._4_4_ = fVar149;
    auVar127._0_4_ = fVar149;
    auVar127._8_4_ = fVar149;
    auVar127._12_4_ = fVar149;
    auVar51 = vcmpps_avx(local_1378,auVar127,2);
    auVar91 = vandps_avx(auVar91,auVar51);
    auVar51 = vcmpps_avx(auVar90,_DAT_01f45a50,4);
    auVar91 = vandps_avx(auVar51,auVar91);
    auVar19._8_8_ = uStack_1450;
    auVar19._0_8_ = local_1458;
    auVar51 = vpand_avx(local_1448,auVar19);
    auVar91 = vpslld_avx(auVar91,0x1f);
    auVar91 = vpsrad_avx(auVar91,0x1f);
    local_13a8 = vpand_avx(auVar91,auVar51);
    auVar94 = ZEXT1664(local_13a8);
    uVar22 = vmovmskps_avx(local_13a8);
    if (uVar22 != 0) {
      local_13e8 = local_1598;
      local_13b8 = &local_15a9;
      auVar91 = vrcpps_avx(local_13c8);
      fVar149 = auVar91._0_4_;
      auVar57._0_4_ = local_13c8._0_4_ * fVar149;
      fVar152 = auVar91._4_4_;
      auVar57._4_4_ = local_13c8._4_4_ * fVar152;
      fVar154 = auVar91._8_4_;
      auVar57._8_4_ = local_13c8._8_4_ * fVar154;
      fVar156 = auVar91._12_4_;
      auVar57._12_4_ = local_13c8._12_4_ * fVar156;
      auVar72._8_4_ = 0x3f800000;
      auVar72._0_8_ = 0x3f8000003f800000;
      auVar72._12_4_ = 0x3f800000;
      auVar75 = ZEXT1664(auVar72);
      auVar91 = vsubps_avx(auVar72,auVar57);
      auVar45._0_4_ = fVar149 + fVar149 * auVar91._0_4_;
      auVar45._4_4_ = fVar152 + fVar152 * auVar91._4_4_;
      auVar45._8_4_ = fVar154 + fVar154 * auVar91._8_4_;
      auVar45._12_4_ = fVar156 + fVar156 * auVar91._12_4_;
      auVar58._8_4_ = 0x219392ef;
      auVar58._0_8_ = 0x219392ef219392ef;
      auVar58._12_4_ = 0x219392ef;
      auVar94 = ZEXT1664(local_1438);
      auVar91 = vcmpps_avx(local_1438,auVar58,5);
      auVar91 = vandps_avx(auVar91,auVar45);
      auVar59._0_4_ = local_1598._0_4_ * auVar91._0_4_;
      auVar59._4_4_ = local_1598._4_4_ * auVar91._4_4_;
      auVar59._8_4_ = local_1598._8_4_ * auVar91._8_4_;
      auVar59._12_4_ = local_1598._12_4_ * auVar91._12_4_;
      local_1398 = vminps_avx(auVar59,auVar72);
      auVar61 = ZEXT1664(local_1398);
      auVar46._0_4_ = local_13d8._0_4_ * auVar91._0_4_;
      auVar46._4_4_ = local_13d8._4_4_ * auVar91._4_4_;
      auVar46._8_4_ = local_13d8._8_4_ * auVar91._8_4_;
      auVar46._12_4_ = local_13d8._12_4_ * auVar91._12_4_;
      local_1388 = vminps_avx(auVar46,auVar72);
      local_1558 = (ulong)(uVar22 & 0xff);
      do {
        uVar25 = 0;
        if (local_1558 != 0) {
          for (; (local_1558 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
          }
        }
        local_14a0 = *(uint *)((long)&local_13f8 + uVar25 * 4);
        pGVar6 = (pSVar30->geometries).items[local_14a0].ptr;
        if ((pGVar6->mask & ray->mask) == 0) {
          local_1558 = local_1558 ^ 1L << (uVar25 & 0x3f);
        }
        else {
          auVar36 = (undefined1  [8])local_1528->args;
          if ((((RTCIntersectArguments *)auVar36)->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00e63f29;
          local_1488.context = local_1528->user;
          local_14b8 = *(uint *)(local_1368 + uVar25 * 4);
          auVar91 = ZEXT416(local_14b8);
          local_14b4 = *(uint *)(local_1358 + uVar25 * 4);
          auVar51 = ZEXT416(local_14b4);
          local_14b0 = *(undefined4 *)(local_1348 + uVar25 * 4);
          local_14ac = *(undefined4 *)(local_1398 + uVar25 * 4);
          local_14a8 = *(undefined4 *)(local_1388 + uVar25 * 4);
          local_14a4 = *(undefined4 *)((long)&local_1408 + uVar25 * 4);
          local_149c = (local_1488.context)->instID[0];
          local_1498 = (local_1488.context)->instPrimID[0];
          local_1588 = ray->tfar;
          local_1578 = uVar25;
          ray->tfar = *(float *)(local_1378 + uVar25 * 4);
          local_155c = -1;
          local_1488.valid = &local_155c;
          local_1488.geometryUserPtr = pGVar6->userPtr;
          local_1488.hit = (RTCHitN *)&local_14b8;
          local_1488.N = 1;
          local_1598._0_8_ = pGVar6;
          local_1488.ray = (RTCRayN *)ray;
          if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e63e19:
            ray = local_1568;
            if ((((RTCIntersectArguments *)auVar36)->filter == (RTCFilterFunctionN)0x0) ||
               (((((RTCIntersectArguments *)auVar36)->flags &
                 RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) == RTC_RAY_QUERY_FLAG_INCOHERENT &&
                ((*(byte *)(local_1598._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_00e63f29:
              ray->tfar = -INFINITY;
              return;
            }
            auVar75 = ZEXT1664(auVar91);
            auVar94 = ZEXT1664(auVar51);
            (*((RTCIntersectArguments *)auVar36)->filter)(&local_1488);
            auVar61._8_56_ = extraout_var_00;
            auVar61._0_8_ = extraout_XMM1_Qa_00;
            ray = local_1568;
            if (*local_1488.valid != 0) goto LAB_00e63f29;
          }
          else {
            local_15a8 = auVar36;
            auVar75 = ZEXT464(local_14b8);
            auVar94 = ZEXT464(local_14b4);
            (*pGVar6->occlusionFilterN)(&local_1488);
            auVar51 = auVar94._0_16_;
            auVar91 = auVar75._0_16_;
            auVar61._8_56_ = extraout_var;
            auVar61._0_8_ = extraout_XMM1_Qa;
            auVar36 = local_15a8;
            if (*local_1488.valid != 0) goto LAB_00e63e19;
          }
          local_1568->tfar = local_1588;
          local_1558 = local_1558 ^ 1L << (local_1578 & 0x3f);
          pSVar30 = local_1520;
          ray = local_1568;
        }
      } while (local_1558 != 0);
    }
  }
  local_14d0 = local_14d0 + 1;
  auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar121 = ZEXT3264(local_1218);
  auVar135 = ZEXT3264(local_1238);
  auVar142 = ZEXT3264(local_1258);
  auVar143 = ZEXT3264(local_1278);
  auVar145 = ZEXT3264(local_1298);
  auVar151 = ZEXT3264(local_12b8);
  auVar160 = ZEXT3264(local_12d8);
  auVar167 = ZEXT3264(local_12f8);
  auVar173 = ZEXT3264(local_1318);
  auVar116 = ZEXT3264(local_1338);
  context = local_1528;
  uVar25 = local_14d8;
  goto LAB_00e634b1;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }